

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

int ASN1_INTEGER_set_int64(ASN1_INTEGER *a,int64_t v)

{
  int iVar1;
  int64_t v_local;
  ASN1_INTEGER *a_local;
  
  if (v < 0) {
    iVar1 = ASN1_INTEGER_set_uint64(a,-v);
    if (iVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      a->type = 0x102;
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = ASN1_INTEGER_set_uint64(a,v);
  }
  return a_local._4_4_;
}

Assistant:

int ASN1_INTEGER_set_int64(ASN1_INTEGER *a, int64_t v) {
  if (v >= 0) {
    return ASN1_INTEGER_set_uint64(a, (uint64_t)v);
  }

  if (!ASN1_INTEGER_set_uint64(a, 0 - (uint64_t)v)) {
    return 0;
  }

  a->type = V_ASN1_NEG_INTEGER;
  return 1;
}